

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::XThreadPaf::FulfillScope::~FulfillScope(FulfillScope *this)

{
  Waiter *pWVar1;
  Locked<kj::Executor::Impl::State> lock;
  Maybe<kj::_::Mutex::Waiter_&> local_18;
  
  if (this->obj != (XThreadPaf *)0x0) {
    MutexGuarded<kj::Executor::Impl::State>::lockExclusive
              ((MutexGuarded<kj::Executor::Impl::State> *)&stack0xffffffffffffffe0,
               (((this->obj->executor).ptr)->impl).ptr);
    List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link>::add
              ((List<kj::_::XThreadPaf,_&kj::_::XThreadPaf::link> *)&local_18.ptr[2].prev,this->obj)
    ;
    this->obj->state = FULFILLED;
    pWVar1 = ((local_18.ptr)->next).ptr;
    if ((pWVar1 != (Waiter *)0x0) && (pWVar1 = (pWVar1->next).ptr, pWVar1 != (Waiter *)0x0)) {
      (*(code *)(((pWVar1->next).ptr)->exception).ptr.disposer)();
    }
    Locked<kj::Executor::Impl::State>::~Locked
              ((Locked<kj::Executor::Impl::State> *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

XThreadPaf::FulfillScope::~FulfillScope() noexcept(false) {
  if (obj != nullptr) {
    auto lock = obj->executor->impl->state.lockExclusive();
    lock->fulfilled.add(*obj);
    __atomic_store_n(&obj->state, FULFILLED, __ATOMIC_RELEASE);
    KJ_IF_SOME(l, lock->loop) {
      KJ_IF_SOME(p, l.port) {
        // TODO(perf): It's annoying we have to call wake() with the lock held, but we have to
        //   prevent the destination EventLoop from being destroyed first.
        p.wake();
      }
    } else {
      // The thread which called kj::newPromiseAndCrossThreadFulfiller<T>() apparently exited its
      // own event loop without canceling the cross-thread promise first. Whoever now owns the
      // promise can only do one thing with it safely: destroy it.
    }
  }
}